

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_three_reg_same(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  TCGContext_conflict1 *pTVar2;
  bool bVar3;
  _Bool _Var4;
  bool bVar5;
  uint uVar6;
  GVecGen3_conflict1 *pGVar7;
  TCGTemp *pTVar8;
  TCGTemp *ts;
  TCGTemp *ts_00;
  long lVar9;
  long lVar10;
  GVecGen4_conflict1 *pGVar11;
  ushort uVar12;
  uint opcode;
  uint uVar13;
  uint uVar14;
  TCGContext_conflict1 *tcg_ctx_3;
  TCGCond cond;
  uint32_t uVar15;
  uint32_t uVar16;
  TCGArg a3;
  uint32_t uVar17;
  int is_s;
  uint uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  TCGArg a3_00;
  int is_2;
  uint uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  uintptr_t o_1;
  ulong uVar25;
  long local_e0;
  
  opcode = insn >> 0xb & 0x1f;
  uVar12 = (ushort)opcode;
  if (uVar12 < 0x20) {
    if ((0xff000000U >> opcode & 1) != 0) {
      uVar24 = insn >> 0x1e & 1;
      uVar6 = insn >> 0x16 & 1;
      if (uVar6 != 0 && ((byte)(insn >> 0x1e) & 1) == 0) goto LAB_006a5361;
      pTVar1 = s->uc->tcg_ctx;
      uVar18 = insn >> 0x17 & 1;
      uVar21 = insn >> 0x1d & 1;
      opcode = uVar21 << 6 | uVar18 << 5 | opcode;
      uVar14 = insn >> 0x10;
      uVar13 = insn >> 5 & 0x1f;
      if (opcode < 0x40) {
        if ((0xc7000000df000000U >> ((ulong)opcode & 0x3f) & 1) != 0) {
LAB_006a5045:
          if (s->fp_access_checked == true) goto LAB_006a5d8f;
          s->fp_access_checked = true;
          uVar15 = s->fp_excp_el;
          if (uVar15 == 0) {
            handle_3same_float(s,uVar6,uVar24 * 0x40 + 0x40 >> (char)uVar6 + 5,opcode,insn & 0x1f,
                               uVar13,uVar14 & 0x1f);
            return;
          }
          goto LAB_006a51c8;
        }
        if ((0x2000000020000000U >> ((ulong)opcode & 0x3f) & 1) == 0) goto LAB_006a4f6a;
      }
      else {
LAB_006a4f6a:
        uVar25 = (ulong)(opcode - 0x58);
        if (0x26 < opcode - 0x58) goto LAB_006a5361;
        if ((0x34000000b8U >> (uVar25 & 0x3f) & 1) != 0) goto LAB_006a5045;
        if ((0x4100000045U >> (uVar25 & 0x3f) & 1) != 0) {
          uVar6 = uVar6 | 2;
          uVar14 = uVar14 & 0x1f;
          uVar18 = 0;
LAB_006a5143:
          handle_simd_3same_pair(s,uVar24,uVar18,opcode,uVar6,uVar13,uVar14,insn & 0x1f);
          return;
        }
        if ((0x200000002U >> (uVar25 & 0x3f) & 1) == 0) goto LAB_006a5361;
      }
      if ((uVar6 == 0) && ((s->isar->id_aa64isar0 & 0xf000000000000) != 0)) {
        _Var4 = fp_access_check(s);
        if (!_Var4) {
          return;
        }
        tcg_gen_gvec_3_ptr_aarch64
                  (pTVar1,(insn & 0x1f) * 0x100 + 0xc10,uVar13 * 0x100 + 0xc10,
                   (uVar14 & 0x1f) * 0x100 + 0xc10,pTVar1->cpu_env,uVar24 * 8 + 8,s->sve_len,
                   uVar18 + uVar21 * 2,gen_helper_gvec_fmlal_a64);
        return;
      }
      goto LAB_006a5361;
    }
    if ((0xb00000U >> opcode & 1) != 0) {
      uVar24 = insn >> 0x1e & 1;
      uVar18 = insn >> 0x1d & 1;
      uVar6 = insn >> 0x16 & 3;
      uVar13 = insn >> 5 & 0x1f;
      if (opcode == 0x17) {
        if ((uVar18 != 0) || (uVar6 == 3 && uVar24 == 0)) goto LAB_006a5361;
        uVar14 = insn >> 0x10 & 0x1f;
        uVar18 = 0;
        opcode = 0x17;
        goto LAB_006a5143;
      }
      if (uVar6 != 3) {
        uVar14 = insn >> 0x10 & 0x1f;
        goto LAB_006a5143;
      }
      goto LAB_006a5361;
    }
    if (opcode == 3) {
      if (s->fp_access_checked == true) goto LAB_006a5d8f;
      s->fp_access_checked = true;
      uVar15 = s->fp_excp_el;
      if (uVar15 == 0) {
        (*(code *)(&DAT_00d78770 +
                  *(int *)(&DAT_00d78770 + (ulong)(insn >> 0x1b & 4 | insn >> 0x16 & 3) * 4)))
                  (s->uc->tcg_ctx,&DAT_00d78770,
                   &DAT_00d78770 +
                   *(int *)(&DAT_00d78770 + (ulong)(insn >> 0x1b & 4 | insn >> 0x16 & 3) * 4),
                   s->sve_len,0,(insn >> 0x1b & 8) + 8);
        return;
      }
      goto LAB_006a51c8;
    }
  }
  pTVar1 = s->uc->tcg_ctx;
  uVar24 = insn >> 0x1e;
  uVar13 = insn >> 0x1d & 1;
  uVar6 = insn >> 0x16 & 3;
  if (uVar12 < 0x17) {
    if ((0x4f015U >> opcode & 1) == 0) {
      if (opcode != 0x13) {
        if (opcode != 0x16) goto LAB_006a5339;
        if ((uVar6 == 3) || (uVar6 == 0)) goto LAB_006a5361;
        goto LAB_006a51a7;
      }
      if (uVar6 != 0 && uVar13 != 0) goto LAB_006a5361;
    }
    if (uVar6 == 3) {
LAB_006a5361:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  else {
LAB_006a5339:
    if ((uVar24 & 1) == 0 && uVar6 == 3) goto LAB_006a5361;
  }
LAB_006a51a7:
  if (s->fp_access_checked == true) {
LAB_006a5d8f:
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  uVar15 = s->fp_excp_el;
  if (uVar15 != 0) {
LAB_006a51c8:
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,uVar15);
    return;
  }
  uVar21 = insn >> 0x10 & 0x1f;
  uVar14 = insn >> 5 & 0x1f;
  uVar18 = insn & 0x1f;
  switch(opcode) {
  case 1:
    uVar19 = uVar18 * 0x100 + 0xc10;
    uVar17 = uVar14 * 0x100 + 0xc10;
    uVar20 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    uVar16 = s->sve_len;
    if (uVar13 == 0) {
      pGVar11 = sqadd_op_aarch64;
    }
    else {
      pGVar11 = uqadd_op_aarch64;
    }
    goto LAB_006a593d;
  default:
    if (uVar6 == 3) {
      if ((uVar24 & 1) == 0) {
        __assert_fail("is_q",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                      ,0x2d3b,"void disas_simd_3same_int(DisasContext *, uint32_t)");
      }
      uVar25 = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        pTVar8 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        ts = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        ts_00 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,
                            (TCGArg)((long)pTVar2 + ((long)pTVar8 - (long)pTVar1)),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),uVar25 | uVar14 * 0x100 + 0xc10
                           );
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,
                            (TCGArg)((long)pTVar2 + ((long)ts - (long)pTVar1)),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),uVar25 | uVar21 * 0x100 + 0xc10
                           );
        handle_3same_64((DisasContext_conflict1 *)s->uc->tcg_ctx,opcode,SUB41(uVar13,0),
                        (TCGv_i64)((long)ts_00 - (long)pTVar1),
                        (TCGv_i64)((long)pTVar8 - (long)pTVar1),(TCGv_i64)((long)ts - (long)pTVar1))
        ;
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i64,
                            (TCGArg)((TCGv_i64)((long)ts_00 - (long)pTVar1) + (long)pTVar2),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),uVar25 | uVar18 * 0x100 + 0xc10
                           );
        tcg_temp_free_internal_aarch64(pTVar1,ts_00);
        tcg_temp_free_internal_aarch64(pTVar1,pTVar8);
        tcg_temp_free_internal_aarch64(pTVar1,ts);
        uVar25 = 8;
        bVar3 = false;
      } while (bVar5);
    }
    else {
      lVar23 = (ulong)(uVar24 & 1) * 2 + 2;
      a3_00 = (ulong)(uVar21 << 8) + 0xc10;
      a3 = (ulong)(uVar14 << 8) + 0xc10;
      local_e0 = 0;
      do {
        pTVar8 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        lVar9 = (long)pTVar8 - (long)pTVar1;
        pTVar8 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        lVar22 = (long)pTVar8 - (long)pTVar1;
        pTVar8 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        lVar10 = (long)pTVar8 - (long)pTVar1;
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i32,(long)pTVar2 + lVar9,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),a3);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i32,(long)pTVar2 + lVar22,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),a3_00);
        if (uVar12 < 0x10) {
          (*(code *)(&DAT_00d787dc + *(int *)(&DAT_00d787dc + (ulong)opcode * 4)))();
          return;
        }
        if (opcode != 0x16) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x2daa,(char *)0x0);
        }
        if (1 < uVar6 - 1) {
          __assert_fail("size == 1 || size == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x2da5,"void disas_simd_3same_int(DisasContext *, uint32_t)");
        }
        (**(code **)((long)disas_simd_scalar_three_reg_same::fns_4[uVar6 - 1] + (ulong)(uVar13 << 3)
                    ))(pTVar1,lVar10,pTVar1->cpu_env,lVar9,lVar22);
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i32,(long)pTVar2 + lVar10,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                            local_e0 * 4 + (ulong)(uVar18 * 0x100 + 0xc10));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar10 + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar9 + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar22 + (long)pTVar1));
        local_e0 = local_e0 + 1;
        a3_00 = a3_00 + 4;
        a3 = a3 + 4;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
    }
    clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,SUB81(s->uc->tcg_ctx,0),
                   uVar24 & 1);
    return;
  case 5:
    uVar19 = uVar18 * 0x100 + 0xc10;
    uVar17 = uVar14 * 0x100 + 0xc10;
    uVar20 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    uVar16 = s->sve_len;
    if (uVar13 == 0) {
      pGVar11 = sqsub_op_aarch64;
    }
    else {
      pGVar11 = uqsub_op_aarch64;
    }
LAB_006a593d:
    tcg_gen_gvec_4_aarch64
              (pTVar1,uVar19,0x2e50,uVar17,uVar20,uVar15,uVar16,
               (GVecGen4_conflict1 *)((long)&pGVar11->fni8 + (ulong)(uVar6 * 0x30)));
    break;
  case 6:
    cond = uVar13 * 2 + TCG_COND_GT;
    goto LAB_006a56b2;
  case 7:
    cond = uVar13 * 2 + TCG_COND_GE;
    goto LAB_006a56b2;
  case 8:
    if (uVar13 == 0) {
      pGVar7 = sshl_op_aarch64;
    }
    else {
      pGVar7 = ushl_op_aarch64;
    }
    pGVar7 = (GVecGen3_conflict1 *)((long)&pGVar7->fni8 + (ulong)(uVar6 * 0x30));
LAB_006a58e3:
    uVar16 = s->sve_len;
    uVar19 = uVar18 * 0x100 + 0xc10;
    uVar17 = uVar14 * 0x100 + 0xc10;
    uVar20 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    goto LAB_006a59a9;
  case 0xc:
    uVar17 = uVar18 * 0x100 + 0xc10;
    uVar16 = uVar14 * 0x100 + 0xc10;
    uVar19 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    if (uVar13 == 0) {
      tcg_gen_gvec_smax_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_umax_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    break;
  case 0xd:
    uVar17 = uVar18 * 0x100 + 0xc10;
    uVar16 = uVar14 * 0x100 + 0xc10;
    uVar19 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    if (uVar13 == 0) {
      tcg_gen_gvec_smin_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_umin_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    break;
  case 0x10:
    uVar17 = uVar18 * 0x100 + 0xc10;
    uVar16 = uVar14 * 0x100 + 0xc10;
    uVar19 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    if (uVar13 == 0) {
      tcg_gen_gvec_add_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_sub_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    break;
  case 0x11:
    cond = TCG_COND_EQ;
    if (uVar13 == 0) {
      pGVar7 = (GVecGen3_conflict1 *)((long)&cmtst_op_aarch64[0].fni8 + (ulong)(uVar6 * 0x30));
      goto LAB_006a58e3;
    }
LAB_006a56b2:
    tcg_gen_gvec_cmp_aarch64
              (pTVar1,cond,uVar6,uVar18 * 0x100 + 0xc10,uVar14 * 0x100 + 0xc10,
               uVar21 * 0x100 + 0xc10,(uVar24 & 1) * 8 + 8,s->sve_len);
    break;
  case 0x12:
    uVar19 = uVar18 * 0x100 + 0xc10;
    uVar17 = uVar14 * 0x100 + 0xc10;
    uVar20 = uVar21 * 0x100 + 0xc10;
    uVar16 = s->sve_len;
    uVar15 = (uVar24 & 1) * 8 + 8;
    if (uVar13 == 0) {
      pGVar7 = (GVecGen3_conflict1 *)((long)&mla_op_aarch64[0].fni8 + (ulong)(uVar6 * 0x30));
    }
    else {
      pGVar7 = (GVecGen3_conflict1 *)((long)&mls_op_aarch64[0].fni8 + (ulong)(uVar6 * 0x30));
    }
LAB_006a59a9:
    tcg_gen_gvec_3_aarch64(pTVar1,uVar19,uVar17,uVar20,uVar15,uVar16,pGVar7);
    break;
  case 0x13:
    uVar17 = uVar18 * 0x100 + 0xc10;
    uVar16 = uVar14 * 0x100 + 0xc10;
    uVar19 = uVar21 * 0x100 + 0xc10;
    uVar15 = (uVar24 & 1) * 8 + 8;
    if (uVar13 == 0) {
      tcg_gen_gvec_mul_aarch64(pTVar1,uVar6,uVar17,uVar16,uVar19,uVar15,s->sve_len);
    }
    else {
      tcg_gen_gvec_3_ool_aarch64
                (pTVar1,uVar17,uVar16,uVar19,uVar15,s->sve_len,0,gen_helper_gvec_pmul_b);
    }
  }
  return;
}

Assistant:

static void disas_simd_three_reg_same(DisasContext *s, uint32_t insn)
{
    int opcode = extract32(insn, 11, 5);

    switch (opcode) {
    case 0x3: /* logic ops */
        disas_simd_3same_logic(s, insn);
        break;
    case 0x17: /* ADDP */
    case 0x14: /* SMAXP, UMAXP */
    case 0x15: /* SMINP, UMINP */
    {
        /* Pairwise operations */
        int is_q = extract32(insn, 30, 1);
        int u = extract32(insn, 29, 1);
        int size = extract32(insn, 22, 2);
        int rm = extract32(insn, 16, 5);
        int rn = extract32(insn, 5, 5);
        int rd = extract32(insn, 0, 5);
        if (opcode == 0x17) {
            if (u || (size == 3 && !is_q)) {
                unallocated_encoding(s);
                return;
            }
        } else {
            if (size == 3) {
                unallocated_encoding(s);
                return;
            }
        }
        handle_simd_3same_pair(s, is_q, u, opcode, size, rn, rm, rd);
        break;
    }
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
        /* floating point ops, sz[1] and U are part of opcode */
        disas_simd_3same_float(s, insn);
        break;
    default:
        disas_simd_3same_int(s, insn);
        break;
    }
}